

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

FirstMatchSequenceExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::FirstMatchSequenceExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SequenceExprSyntax&,slang::syntax::SequenceMatchListSyntax*,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,SequenceExprSyntax *args_2,
          SequenceMatchListSyntax **args_3,Token *args_4)

{
  SequenceMatchListSyntax *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  FirstMatchSequenceExprSyntax *pFVar17;
  
  pFVar17 = (FirstMatchSequenceExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((FirstMatchSequenceExprSyntax *)this->endPtr < pFVar17 + 1) {
    pFVar17 = (FirstMatchSequenceExprSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pFVar17 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar2 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar3 = args_1->info;
  pSVar1 = *args_3;
  TVar13 = args_4->kind;
  uVar14 = args_4->field_0x2;
  NVar15.raw = (args_4->numFlags).raw;
  uVar16 = args_4->rawLen;
  pIVar4 = args_4->info;
  (pFVar17->super_SequenceExprSyntax).super_SyntaxNode.kind = FirstMatchSequenceExpr;
  (pFVar17->super_SequenceExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pFVar17->super_SequenceExprSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pFVar17->first_match).kind = TVar5;
  (pFVar17->first_match).field_0x2 = uVar6;
  (pFVar17->first_match).numFlags = (NumericTokenFlags)NVar7.raw;
  (pFVar17->first_match).rawLen = uVar8;
  (pFVar17->first_match).info = pIVar2;
  (pFVar17->openParen).kind = TVar9;
  (pFVar17->openParen).field_0x2 = uVar10;
  (pFVar17->openParen).numFlags = (NumericTokenFlags)NVar11.raw;
  (pFVar17->openParen).rawLen = uVar12;
  (pFVar17->openParen).info = pIVar3;
  (pFVar17->expr).ptr = args_2;
  pFVar17->matchList = pSVar1;
  (pFVar17->closeParen).kind = TVar13;
  (pFVar17->closeParen).field_0x2 = uVar14;
  (pFVar17->closeParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (pFVar17->closeParen).rawLen = uVar16;
  (pFVar17->closeParen).info = pIVar4;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pFVar17;
  if (pSVar1 != (SequenceMatchListSyntax *)0x0) {
    (pSVar1->super_SyntaxNode).parent = (SyntaxNode *)pFVar17;
  }
  return pFVar17;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }